

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void __thiscall Server::start(Server *this)

{
  EventLoop *this_00;
  pointer this_01;
  element_type *peVar1;
  shared_ptr<Channel> local_d0;
  Server *local_c0;
  code *local_b8;
  undefined8 local_b0;
  type local_a8;
  CallBack local_90;
  Server *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  CallBack local_30;
  Server *local_10;
  Server *this_local;
  
  local_10 = this;
  this_01 = std::unique_ptr<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>::
            operator->(&this->eventLoopThreadPool_);
  EventLoopThreadPool::start(this_01);
  peVar1 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->acceptChannel_);
  Channel::setEvents(peVar1,0x80000001);
  peVar1 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->acceptChannel_);
  local_58 = handNewConn;
  local_50 = 0;
  local_60 = this;
  std::bind<void(Server::*)(),Server*>(&local_48,(offset_in_Server_to_subr *)&local_58,&local_60);
  std::function<void()>::function<std::_Bind<void(Server::*(Server*))()>,void>
            ((function<void()> *)&local_30,&local_48);
  Channel::setReadHandler(peVar1,&local_30);
  std::function<void_()>::~function(&local_30);
  peVar1 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->acceptChannel_);
  local_b8 = handThisConn;
  local_b0 = 0;
  local_c0 = this;
  std::bind<void(Server::*)(),Server*>(&local_a8,(offset_in_Server_to_subr *)&local_b8,&local_c0);
  std::function<void()>::function<std::_Bind<void(Server::*(Server*))()>,void>
            ((function<void()> *)&local_90,&local_a8);
  Channel::setConnHandler(peVar1,&local_90);
  std::function<void_()>::~function(&local_90);
  this_00 = this->loop_;
  std::shared_ptr<Channel>::shared_ptr(&local_d0,&this->acceptChannel_);
  EventLoop::addToPoller(this_00,&local_d0,0);
  std::shared_ptr<Channel>::~shared_ptr(&local_d0);
  this->started_ = true;
  return;
}

Assistant:

void Server::start() {
  eventLoopThreadPool_->start();
  // acceptChannel_->setEvents(EPOLLIN | EPOLLET | EPOLLONESHOT);
  acceptChannel_->setEvents(EPOLLIN | EPOLLET);
  acceptChannel_->setReadHandler(bind(&Server::handNewConn, this));
  acceptChannel_->setConnHandler(bind(&Server::handThisConn, this));
  loop_->addToPoller(acceptChannel_, 0);
  started_ = true;
}